

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadCodeElimination.cpp
# Opt level: O0

Expression * __thiscall
wasm::DeadCodeElimination::replaceCurrent(DeadCodeElimination *this,Expression *expression)

{
  Expression *from;
  Expression *old;
  Expression *expression_local;
  DeadCodeElimination *this_local;
  
  from = Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
         ::getCurrent(&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>_>
                       ).
                       super_PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                       .
                       super_Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                     );
  if (from != expression) {
    Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>_>
                      ).
                      super_PostWalker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                      .
                      super_Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
                     ,expression);
    TypeUpdater::noteReplacement(&this->typeUpdater,from,expression,false);
  }
  return expression;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    auto* old = getCurrent();
    if (old == expression) {
      return expression;
    }
    Super::replaceCurrent(expression);
    // also update the type updater
    typeUpdater.noteReplacement(old, expression);
    return expression;
  }